

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O3

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpath::detail::
or_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::evaluate
          (or_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,const_reference lhs,const_reference rhs,error_code *param_3)

{
  byte bVar1;
  bool bVar2;
  const_reference pvVar3;
  error_code *peVar4;
  undefined8 extraout_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar5;
  
  pvVar3 = rhs;
  while ((*(byte *)&pvVar3->field_0 & 0xf) - 8 < 2) {
    pvVar3 = *(const_reference *)((long)&pvVar3->field_0 + 8);
  }
  peVar4 = param_3;
  if ((*(byte *)&pvVar3->field_0 & 0xf) == 0) {
    while (bVar1 = (byte)peVar4->_M_value, (bVar1 & 0xf) - 8 < 2) {
      peVar4 = (error_code *)peVar4->_M_cat;
    }
    if ((bVar1 & 0xf) == 0) {
      param_3 = (error_code *)
                basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
      goto LAB_003c0cec;
    }
  }
  bVar2 = is_false<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>(rhs);
  if (!bVar2) {
    param_3 = (error_code *)rhs;
  }
LAB_003c0cec:
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)param_3);
  bVar5.field_0.int64_.val_ = extraout_RDX;
  bVar5.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar5.field_0;
}

Assistant:

Json evaluate(const_reference lhs, const_reference rhs, std::error_code&) const override
        {
            if (lhs.is_null() && rhs.is_null())
            {
                return Json::null();
            }
            if (!is_false(lhs))
            {
                return lhs;
            }
            return rhs;
        }